

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_large_scale_tile_obu_size
               (CommonTileParams *tiles,uint8_t *dst,uint8_t *data,aom_write_bit_buffer *saved_wb,
               LargeTileFrameOBU *lst_obu,int have_tiles,uint32_t *total_size,int max_tile_size,
               int max_tile_col_size)

{
  int iVar1;
  aom_write_bit_buffer *wb;
  long *in_RCX;
  int *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int *in_R8;
  int in_R9D;
  uint8_t *unaff_retaddr;
  size_t length_field_size;
  uint32_t obu_payload_size;
  int tile_col_size_bytes;
  int tile_size_bytes;
  undefined1 *in_stack_ffffffffffffffb8;
  undefined4 uVar2;
  undefined4 uVar3;
  
  uVar3 = 0;
  uVar2 = 0;
  if (in_R9D != 0) {
    in_stack_ffffffffffffffb8 = &stack0xffffffffffffffcc;
    iVar1 = remux_tiles((CommonTileParams *)length_field_size,unaff_retaddr,
                        (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
                        (uint32_t)((ulong)in_RSI >> 0x20),in_RDX,(int *)lst_obu);
    *(int *)length_field_size = iVar1;
    *(int *)length_field_size = in_R8[1] + *(int *)length_field_size;
  }
  *(int *)length_field_size = *in_R8 + *(int *)length_field_size;
  iVar1 = *(int *)length_field_size - *in_R8;
  wb = (aom_write_bit_buffer *)
       obu_memmove_unsafe((size_t)in_RCX,(size_t)in_R8,(uint8_t *)CONCAT44(in_R9D,uVar3));
  av1_write_uleb_obu_size_unsafe(CONCAT44(uVar2,iVar1),(uint8_t *)wb);
  *(int *)length_field_size = (int)wb + *(int *)length_field_size;
  *in_RCX = (long)&wb->bit_buffer + *in_RCX;
  if (in_R9D != 0) {
    aom_wb_overwrite_literal
              (wb,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
    aom_wb_overwrite_literal
              (wb,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

static void write_large_scale_tile_obu_size(
    const CommonTileParams *const tiles, uint8_t *const dst, uint8_t *data,
    struct aom_write_bit_buffer *saved_wb, LargeTileFrameOBU *const lst_obu,
    int have_tiles, uint32_t *total_size, int max_tile_size,
    int max_tile_col_size) {
  int tile_size_bytes = 0;
  int tile_col_size_bytes = 0;
  if (have_tiles) {
    *total_size = remux_tiles(
        tiles, data, *total_size - lst_obu->frame_header_size, max_tile_size,
        max_tile_col_size, &tile_size_bytes, &tile_col_size_bytes);
    *total_size += lst_obu->frame_header_size;
  }

  // In EXT_TILE case, only use 1 tile group. Follow the obu syntax, write
  // current tile group size before tile data(include tile column header).
  // Tile group size doesn't include the bytes storing tg size.
  *total_size += lst_obu->tg_hdr_size;
  const uint32_t obu_payload_size = *total_size - lst_obu->tg_hdr_size;
  const size_t length_field_size =
      obu_memmove_unsafe(lst_obu->tg_hdr_size, obu_payload_size, dst);
  if (av1_write_uleb_obu_size_unsafe(
          obu_payload_size, dst + lst_obu->tg_hdr_size) != AOM_CODEC_OK)
    assert(0);

  *total_size += (uint32_t)length_field_size;
  saved_wb->bit_buffer += length_field_size;

  // Now fill in the gaps in the uncompressed header.
  if (have_tiles) {
    assert(tile_col_size_bytes >= 1 && tile_col_size_bytes <= 4);
    aom_wb_overwrite_literal(saved_wb, tile_col_size_bytes - 1, 2);

    assert(tile_size_bytes >= 1 && tile_size_bytes <= 4);
    aom_wb_overwrite_literal(saved_wb, tile_size_bytes - 1, 2);
  }
}